

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StorageSaveTotals(Fts5Storage *p)

{
  uint uVar1;
  Fts5Index *p_00;
  u8 *p_01;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int local_4c;
  Fts5Buffer buf;
  
  uVar1 = p->pConfig->nCol;
  local_4c = 0;
  buf.p = (u8 *)0x0;
  buf.n = 0;
  buf.nSpace = 0;
  sqlite3Fts5BufferAppendVarint(&local_4c,&buf,p->nTotalRow);
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; p_01 = buf.p, uVar3 != uVar4; uVar4 = uVar4 + 1) {
    sqlite3Fts5BufferAppendVarint(&local_4c,&buf,p->aTotalSize[uVar4]);
  }
  iVar2 = local_4c;
  if (local_4c == 0) {
    p_00 = p->pIndex;
    fts5DataWrite(p_00,1,buf.p,buf.n);
    iVar2 = p_00->rc;
    p_00->rc = 0;
  }
  sqlite3_free(p_01);
  return iVar2;
}

Assistant:

static int fts5StorageSaveTotals(Fts5Storage *p){
  int nCol = p->pConfig->nCol;
  int i;
  Fts5Buffer buf;
  int rc = SQLITE_OK;
  memset(&buf, 0, sizeof(buf));

  sqlite3Fts5BufferAppendVarint(&rc, &buf, p->nTotalRow);
  for(i=0; i<nCol; i++){
    sqlite3Fts5BufferAppendVarint(&rc, &buf, p->aTotalSize[i]);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexSetAverages(p->pIndex, buf.p, buf.n);
  }
  sqlite3_free(buf.p);

  return rc;
}